

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O0

void __thiscall
glslang::TBuiltIns::addImageFunctions
          (TBuiltIns *this,TSampler sampler,TString *typeName,int version,EProfile profile)

{
  bool bVar1;
  undefined1 local_f0 [8];
  TString imageLodParams;
  int local_c0;
  int local_bc;
  int i_1;
  int j_1;
  char *atomicFp16DataTypes [2];
  int numFp16DataTypes;
  char *atomicFp16Func [4];
  ulong uStack_70;
  int numFp16Builtins;
  size_t i;
  int j;
  int numBuiltins;
  char *dataType;
  TString imageParams;
  int dims;
  EProfile profile_local;
  int version_local;
  TString *typeName_local;
  TBuiltIns *this_local;
  TSampler sampler_local;
  
  imageParams.field_2._12_4_ = this->dimMap[(uint)sampler >> 8 & 0xff];
  if ((((uint)sampler >> 0x10 & 1) != 0) && (((uint)sampler >> 8 & 0xff) != 4)) {
    imageParams.field_2._12_4_ = imageParams.field_2._12_4_ + 1;
  }
  this_local._4_4_ = sampler;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &dataType,typeName);
  if (imageParams.field_2._12_4_ == 1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &dataType,", int");
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &dataType,", ivec");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &dataType,this->postfixes[(int)imageParams.field_2._12_4_]);
  }
  bVar1 = TSampler::isMultiSample((TSampler *)((long)&this_local + 4));
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &dataType,", int");
  }
  if (profile == EEsProfile) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&(this->super_TBuiltInParseables).commonBuiltins,"highp ");
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (&(this->super_TBuiltInParseables).commonBuiltins,
             this->prefixes[(uint)this_local._4_4_ & 0xff]);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (&(this->super_TBuiltInParseables).commonBuiltins,
             "vec4 imageLoad(readonly volatile coherent nontemporal ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (&(this->super_TBuiltInParseables).commonBuiltins,
             (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)&dataType
            );
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (&(this->super_TBuiltInParseables).commonBuiltins,");\n");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (&(this->super_TBuiltInParseables).commonBuiltins,
             "void imageStore(writeonly volatile coherent nontemporal ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (&(this->super_TBuiltInParseables).commonBuiltins,
             (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)&dataType
            );
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (&(this->super_TBuiltInParseables).commonBuiltins,", ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (&(this->super_TBuiltInParseables).commonBuiltins,
             this->prefixes[(uint)this_local._4_4_ & 0xff]);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (&(this->super_TBuiltInParseables).commonBuiltins,"vec4);\n");
  bVar1 = TSampler::is1D((TSampler *)((long)&this_local + 4));
  if ((((!bVar1) && (bVar1 = TSampler::isBuffer((TSampler *)((long)&this_local + 4)), !bVar1)) &&
      (profile != EEsProfile)) && (0x1c1 < version)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&(this->super_TBuiltInParseables).commonBuiltins,
               "int sparseImageLoadARB(readonly volatile coherent nontemporal ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&(this->super_TBuiltInParseables).commonBuiltins,
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &dataType);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&(this->super_TBuiltInParseables).commonBuiltins,", out ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&(this->super_TBuiltInParseables).commonBuiltins,
               this->prefixes[(uint)this_local._4_4_ & 0xff]);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&(this->super_TBuiltInParseables).commonBuiltins,"vec4");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&(this->super_TBuiltInParseables).commonBuiltins,");\n");
  }
  if ((profile != EEsProfile) || (0x135 < version)) {
    if (((((uint)this_local._4_4_ & 0xff) == 8) ||
        ((((uint)this_local._4_4_ & 0xff) == 9 || (((uint)this_local._4_4_ & 0xff) == 10)))) ||
       (((uint)this_local._4_4_ & 0xff) == 0xb)) {
      switch((uint)this_local._4_4_ & 0xff) {
      case 8:
        _j = "highp int";
        break;
      case 9:
        _j = "highp uint";
        break;
      case 10:
        _j = "highp int64_t";
        break;
      case 0xb:
        _j = "highp uint64_t";
        break;
      default:
        _j = "";
      }
      for (i._0_4_ = 0; (int)i < 2; i._0_4_ = (int)i + 1) {
        for (uStack_70 = 0; uStack_70 < 7; uStack_70 = uStack_70 + 1) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(&(this->super_TBuiltInParseables).commonBuiltins,_j);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(&(this->super_TBuiltInParseables).commonBuiltins,
                 addImageFunctions::atomicFunc[uStack_70]);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(&(this->super_TBuiltInParseables).commonBuiltins,
                 (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 &dataType);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(&(this->super_TBuiltInParseables).commonBuiltins,", ");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(&(this->super_TBuiltInParseables).commonBuiltins,_j);
          if ((int)i == 1) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::append(&(this->super_TBuiltInParseables).commonBuiltins,", int, int, int");
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(&(this->super_TBuiltInParseables).commonBuiltins,");\n");
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,_j);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               " imageAtomicCompSwap(volatile coherent nontemporal ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &dataType);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,", ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,_j);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,", ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,_j);
        if ((int)i == 1) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(&(this->super_TBuiltInParseables).commonBuiltins,", int, int, int, int, int");
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,");\n");
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,_j);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,
             " imageAtomicLoad(volatile coherent nontemporal ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,
             (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)&dataType
            );
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,", int, int, int);\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,
             "void imageAtomicStore(volatile coherent nontemporal ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,
             (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)&dataType
            );
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,", ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,_j);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,", int, int, int);\n");
    }
    else {
      if ((profile == EEsProfile) && (0x135 < version)) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               "float imageAtomicExchange(volatile coherent nontemporal ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &dataType);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,", float);\n");
      }
      if ((profile != EEsProfile) && (0x1ad < version)) {
        atomicFp16Func[3]._4_4_ = 4;
        atomicFp16Func[0] = " imageAtomicMin(volatile coherent nontemporal ";
        atomicFp16Func[1] = " imageAtomicMax(volatile coherent nontemporal ";
        atomicFp16Func[2] = " imageAtomicExchange(volatile coherent nontemporal ";
        _i_1 = "f16vec2";
        atomicFp16DataTypes[0] = "f16vec4";
        for (local_bc = 0; local_bc < 2; local_bc = local_bc + 1) {
          for (local_c0 = 0; local_c0 < 4; local_c0 = local_c0 + 1) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::append(&(this->super_TBuiltInParseables).commonBuiltins,
                     *(char **)(&i_1 + (long)local_bc * 2));
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::append(&(this->super_TBuiltInParseables).commonBuiltins,
                     atomicFp16Func[(long)local_c0 + -1]);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::append(&(this->super_TBuiltInParseables).commonBuiltins,
                     (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                     &dataType);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::append(&(this->super_TBuiltInParseables).commonBuiltins,", ");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::append(&(this->super_TBuiltInParseables).commonBuiltins,
                     *(char **)(&i_1 + (long)local_bc * 2));
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::append(&(this->super_TBuiltInParseables).commonBuiltins,");\n");
          }
        }
      }
      if ((profile != EEsProfile) && (0x1c1 < version)) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               "float imageAtomicAdd(volatile coherent nontemporal ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &dataType);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,", float);\n");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               "float imageAtomicAdd(volatile coherent nontemporal ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &dataType);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,", float");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,", int, int, int);\n");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               "float imageAtomicExchange(volatile coherent nontemporal ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &dataType);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,", float);\n");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               "float imageAtomicExchange(volatile coherent nontemporal ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &dataType);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,", float");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,", int, int, int);\n");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               "float imageAtomicLoad(readonly volatile coherent nontemporal ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &dataType);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,", int, int, int);\n");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               "void imageAtomicStore(writeonly volatile coherent nontemporal ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &dataType);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,", float");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,", int, int, int);\n");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               "float imageAtomicMin(volatile coherent nontemporal ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &dataType);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,", float);\n");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               "float imageAtomicMin(volatile coherent nontemporal ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &dataType);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,", float");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,", int, int, int);\n");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               "float imageAtomicMax(volatile coherent nontemporal ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &dataType);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,", float);\n");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               "float imageAtomicMax(volatile coherent nontemporal ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &dataType);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,", float");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,", int, int, int);\n");
      }
    }
  }
  if ((((((uint)this_local._4_4_ >> 8 & 0xff) == 5) || (((uint)this_local._4_4_ >> 8 & 0xff) == 6))
      || (((uint)this_local._4_4_ >> 0x11 & 1) != 0)) ||
     (bVar1 = TSampler::isMultiSample((TSampler *)((long)&this_local + 4)), bVar1)) {
    imageLodParams.field_2._12_4_ = 1;
  }
  else if ((profile == EEsProfile) || (version < 0x1c2)) {
    imageLodParams.field_2._12_4_ = 1;
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 local_f0,typeName);
    if (imageParams.field_2._12_4_ == 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)local_f0,
             ", int");
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)local_f0,
             ", ivec");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)local_f0,
             this->postfixes[(int)imageParams.field_2._12_4_]);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               local_f0,", int");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&(this->super_TBuiltInParseables).commonBuiltins,
               this->prefixes[(uint)this_local._4_4_ & 0xff]);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&(this->super_TBuiltInParseables).commonBuiltins,
               "vec4 imageLoadLodAMD(readonly volatile coherent nontemporal ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&(this->super_TBuiltInParseables).commonBuiltins,
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               local_f0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&(this->super_TBuiltInParseables).commonBuiltins,");\n");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&(this->super_TBuiltInParseables).commonBuiltins,
               "void imageStoreLodAMD(writeonly volatile coherent nontemporal ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&(this->super_TBuiltInParseables).commonBuiltins,
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               local_f0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&(this->super_TBuiltInParseables).commonBuiltins,", ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&(this->super_TBuiltInParseables).commonBuiltins,
               this->prefixes[(uint)this_local._4_4_ & 0xff]);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&(this->super_TBuiltInParseables).commonBuiltins,"vec4);\n");
    bVar1 = TSampler::is1D((TSampler *)((long)&this_local + 4));
    if (!bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,
             "int sparseImageLoadLodAMD(readonly volatile coherent nontemporal ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,
             (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)local_f0)
      ;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,", out ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,
             this->prefixes[(uint)this_local._4_4_ & 0xff]);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,"vec4");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,");\n");
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  local_f0);
    imageLodParams.field_2._12_4_ = 0;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                &dataType);
  return;
}

Assistant:

void TBuiltIns::addImageFunctions(TSampler sampler, const TString& typeName, int version, EProfile profile)
{
    int dims = dimMap[sampler.dim];
    // most things with an array add a dimension, except for cubemaps
    if (sampler.arrayed && sampler.dim != EsdCube)
        ++dims;

    TString imageParams = typeName;
    if (dims == 1)
        imageParams.append(", int");
    else {
        imageParams.append(", ivec");
        imageParams.append(postfixes[dims]);
    }
    if (sampler.isMultiSample())
        imageParams.append(", int");

    if (profile == EEsProfile)
        commonBuiltins.append("highp ");
    commonBuiltins.append(prefixes[sampler.type]);
    commonBuiltins.append("vec4 imageLoad(readonly volatile coherent nontemporal ");
    commonBuiltins.append(imageParams);
    commonBuiltins.append(");\n");

    commonBuiltins.append("void imageStore(writeonly volatile coherent nontemporal ");
    commonBuiltins.append(imageParams);
    commonBuiltins.append(", ");
    commonBuiltins.append(prefixes[sampler.type]);
    commonBuiltins.append("vec4);\n");

    if (! sampler.is1D() && ! sampler.isBuffer() && profile != EEsProfile && version >= 450) {
        commonBuiltins.append("int sparseImageLoadARB(readonly volatile coherent nontemporal ");
        commonBuiltins.append(imageParams);
        commonBuiltins.append(", out ");
        commonBuiltins.append(prefixes[sampler.type]);
        commonBuiltins.append("vec4");
        commonBuiltins.append(");\n");
    }

    if ( profile != EEsProfile ||
        (profile == EEsProfile && version >= 310)) {
        if (sampler.type == EbtInt || sampler.type == EbtUint || sampler.type == EbtInt64 || sampler.type == EbtUint64 ) {
            
            const char* dataType;
            switch (sampler.type) {
                case(EbtInt): dataType = "highp int"; break;
                case(EbtUint): dataType = "highp uint"; break;
                case(EbtInt64): dataType = "highp int64_t"; break;
                case(EbtUint64): dataType = "highp uint64_t"; break;
                default: dataType = "";
            }

            const int numBuiltins = 7;

            static const char* atomicFunc[numBuiltins] = {
                " imageAtomicAdd(volatile coherent nontemporal ",
                " imageAtomicMin(volatile coherent nontemporal ",
                " imageAtomicMax(volatile coherent nontemporal ",
                " imageAtomicAnd(volatile coherent nontemporal ",
                " imageAtomicOr(volatile coherent nontemporal ",
                " imageAtomicXor(volatile coherent nontemporal ",
                " imageAtomicExchange(volatile coherent nontemporal "
            };

            // Loop twice to add prototypes with/without scope/semantics
            for (int j = 0; j < 2; ++j) {
                for (size_t i = 0; i < numBuiltins; ++i) {
                    commonBuiltins.append(dataType);
                    commonBuiltins.append(atomicFunc[i]);
                    commonBuiltins.append(imageParams);
                    commonBuiltins.append(", ");
                    commonBuiltins.append(dataType);
                    if (j == 1) {
                        commonBuiltins.append(", int, int, int");
                    }
                    commonBuiltins.append(");\n");
                }

                commonBuiltins.append(dataType);
                commonBuiltins.append(" imageAtomicCompSwap(volatile coherent nontemporal ");
                commonBuiltins.append(imageParams);
                commonBuiltins.append(", ");
                commonBuiltins.append(dataType);
                commonBuiltins.append(", ");
                commonBuiltins.append(dataType);
                if (j == 1) {
                    commonBuiltins.append(", int, int, int, int, int");
                }
                commonBuiltins.append(");\n");
            }

            commonBuiltins.append(dataType);
            commonBuiltins.append(" imageAtomicLoad(volatile coherent nontemporal ");
            commonBuiltins.append(imageParams);
            commonBuiltins.append(", int, int, int);\n");

            commonBuiltins.append("void imageAtomicStore(volatile coherent nontemporal ");
            commonBuiltins.append(imageParams);
            commonBuiltins.append(", ");
            commonBuiltins.append(dataType);
            commonBuiltins.append(", int, int, int);\n");

        } else {
            // not int or uint
            // GL_ARB_ES3_1_compatibility
            // TODO: spec issue: are there restrictions on the kind of layout() that can be used?  what about dropping memory qualifiers?
            if (profile == EEsProfile && version >= 310) {
                commonBuiltins.append("float imageAtomicExchange(volatile coherent nontemporal ");
                commonBuiltins.append(imageParams);
                commonBuiltins.append(", float);\n");
            }

            // GL_NV_shader_atomic_fp16_vector
            if (profile != EEsProfile && version >= 430) {
                const int numFp16Builtins = 4;
                const char* atomicFp16Func[numFp16Builtins] = {
                    " imageAtomicAdd(volatile coherent nontemporal ",
                    " imageAtomicMin(volatile coherent nontemporal ",
                    " imageAtomicMax(volatile coherent nontemporal ",
                    " imageAtomicExchange(volatile coherent nontemporal "
                };
                const int numFp16DataTypes = 2;
                const char* atomicFp16DataTypes[numFp16DataTypes] = {
                    "f16vec2",
                    "f16vec4"
                };
                // Loop twice to add prototypes with/without scope/semantics
                for (int j = 0; j < numFp16DataTypes; ++j) {
                    for (int i = 0; i < numFp16Builtins; ++i) {
                        commonBuiltins.append(atomicFp16DataTypes[j]);
                        commonBuiltins.append(atomicFp16Func[i]);
                        commonBuiltins.append(imageParams);
                        commonBuiltins.append(", ");
                        commonBuiltins.append(atomicFp16DataTypes[j]);
                        commonBuiltins.append(");\n");
                    }
                }
            }

            if (profile != EEsProfile && version >= 450) {
                commonBuiltins.append("float imageAtomicAdd(volatile coherent nontemporal ");
                commonBuiltins.append(imageParams);
                commonBuiltins.append(", float);\n");

                commonBuiltins.append("float imageAtomicAdd(volatile coherent nontemporal ");
                commonBuiltins.append(imageParams);
                commonBuiltins.append(", float");
                commonBuiltins.append(", int, int, int);\n");

                commonBuiltins.append("float imageAtomicExchange(volatile coherent nontemporal ");
                commonBuiltins.append(imageParams);
                commonBuiltins.append(", float);\n");

                commonBuiltins.append("float imageAtomicExchange(volatile coherent nontemporal ");
                commonBuiltins.append(imageParams);
                commonBuiltins.append(", float");
                commonBuiltins.append(", int, int, int);\n");

                commonBuiltins.append("float imageAtomicLoad(readonly volatile coherent nontemporal ");
                commonBuiltins.append(imageParams);
                commonBuiltins.append(", int, int, int);\n");

                commonBuiltins.append("void imageAtomicStore(writeonly volatile coherent nontemporal ");
                commonBuiltins.append(imageParams);
                commonBuiltins.append(", float");
                commonBuiltins.append(", int, int, int);\n");

                commonBuiltins.append("float imageAtomicMin(volatile coherent nontemporal ");
                commonBuiltins.append(imageParams);
                commonBuiltins.append(", float);\n");

                commonBuiltins.append("float imageAtomicMin(volatile coherent nontemporal ");
                commonBuiltins.append(imageParams);
                commonBuiltins.append(", float");
                commonBuiltins.append(", int, int, int);\n");

                commonBuiltins.append("float imageAtomicMax(volatile coherent nontemporal ");
                commonBuiltins.append(imageParams);
                commonBuiltins.append(", float);\n");

                commonBuiltins.append("float imageAtomicMax(volatile coherent nontemporal ");
                commonBuiltins.append(imageParams);
                commonBuiltins.append(", float");
                commonBuiltins.append(", int, int, int);\n");
            }
        }
    }

    if (sampler.dim == EsdRect || sampler.dim == EsdBuffer || sampler.shadow || sampler.isMultiSample())
        return;

    if (profile == EEsProfile || version < 450)
        return;

    TString imageLodParams = typeName;
    if (dims == 1)
        imageLodParams.append(", int");
    else {
        imageLodParams.append(", ivec");
        imageLodParams.append(postfixes[dims]);
    }
    imageLodParams.append(", int");

    commonBuiltins.append(prefixes[sampler.type]);
    commonBuiltins.append("vec4 imageLoadLodAMD(readonly volatile coherent nontemporal ");
    commonBuiltins.append(imageLodParams);
    commonBuiltins.append(");\n");

    commonBuiltins.append("void imageStoreLodAMD(writeonly volatile coherent nontemporal ");
    commonBuiltins.append(imageLodParams);
    commonBuiltins.append(", ");
    commonBuiltins.append(prefixes[sampler.type]);
    commonBuiltins.append("vec4);\n");

    if (! sampler.is1D()) {
        commonBuiltins.append("int sparseImageLoadLodAMD(readonly volatile coherent nontemporal ");
        commonBuiltins.append(imageLodParams);
        commonBuiltins.append(", out ");
        commonBuiltins.append(prefixes[sampler.type]);
        commonBuiltins.append("vec4");
        commonBuiltins.append(");\n");
    }
}